

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

void __thiscall
bloaty::Rollup::CreateDiffModeRollupOutput
          (Rollup *this,Rollup *base,Options *options,RollupOutput *output)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int64_t iVar4;
  
  lVar1 = this->vm_total_;
  lVar2 = this->file_total_;
  *(long *)(output + 0x38) = lVar1;
  *(long *)(output + 0x40) = lVar2;
  iVar4 = this->filtered_file_total_;
  *(int64_t *)(output + 0x48) = this->filtered_vm_total_;
  *(int64_t *)(output + 0x50) = iVar4;
  *(undefined8 *)(output + 0x68) = 0x4059000000000000;
  *(undefined8 *)(output + 0x70) = 0x4059000000000000;
  if (base != (Rollup *)0x0) {
    lVar3 = base->file_total_;
    *(long *)(output + 0x38) = lVar1 - base->vm_total_;
    *(long *)(output + 0x40) = lVar2 - lVar3;
  }
  output[0xc0] = (RollupOutput)0x1;
  CreateRows(this,(RollupRow *)(output + 0x18),base,options,true);
  return;
}

Assistant:

void CreateDiffModeRollupOutput(Rollup* base, const Options& options,
                                  RollupOutput* output) const {
    RollupRow* row = &output->toplevel_row_;
    row->size.vm = vm_total_;
    row->size.file = file_total_;
    row->filtered_size.vm = filtered_vm_total_;
    row->filtered_size.file = filtered_file_total_;
    row->vmpercent = 100;
    row->filepercent = 100;
    if (base) {
      row->size.vm -= base->vm_total_;
      row->size.file -= base->file_total_;
    }
    output->diff_mode_ = true;
    CreateRows(row, base, options, true);
  }